

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getBranchChangeLocations
          (RelationsAnalyzer *this,VRLocation *join,VectorSet<const_llvm::Value_*> *froms)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RCX;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *in_RDI;
  V from;
  const_iterator __end3;
  const_iterator __begin3;
  VectorSet<const_llvm::Value_*> *__range3;
  bool hasLoad;
  VRLocation *loc;
  uint i;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> changeLocations;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar3;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *this_00;
  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_60;
  undefined8 local_58;
  byte local_49;
  VRLocation *local_48;
  uint local_3c;
  undefined8 local_20;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::vector
            ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
             0x1d078b);
  local_3c = 0;
  do {
    uVar3 = local_3c;
    uVar2 = VRLocation::predsSize((VRLocation *)0x1d07a8);
    if (uVar2 <= uVar3) {
      std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::vector
                ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
                 CONCAT44(uVar3,in_stack_ffffffffffffff70),
                 (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
                 CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
LAB_001d08b0:
      std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::~vector
                (this_00);
      return this_00;
    }
    local_48 = VRLocation::getPredLocation
                         ((VRLocation *)CONCAT44(uVar3,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c);
    local_49 = 0;
    local_58 = local_20;
    local_60._M_current =
         (Value **)
         VectorSet<const_llvm::Value_*>::begin
                   ((VectorSet<const_llvm::Value_*> *)
                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    VectorSet<const_llvm::Value_*>::end
              ((VectorSet<const_llvm::Value_*> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)CONCAT44(uVar3,in_stack_ffffffffffffff70),
                              (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator*(&local_60);
      bVar1 = ValueRelations::hasLoad<llvm::Value_const*>
                        ((ValueRelations *)CONCAT44(uVar3,in_stack_ffffffffffffff70),
                         (Value **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (bVar1) {
        local_49 = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
      ::operator++(&local_60);
    }
    if ((local_49 & 1) == 0) {
      memset(in_RDI,0,0x18);
      std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::vector
                ((vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *)
                 0x1d0870);
      goto LAB_001d08b0;
    }
    std::vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>>::
    emplace_back<dg::vr::VRLocation*&>(this_00,(VRLocation **)in_RDI);
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

std::vector<const VRLocation *>
RelationsAnalyzer::getBranchChangeLocations(const VRLocation &join,
                                            const VectorSet<V> &froms) const {
    std::vector<const VRLocation *> changeLocations;
    for (unsigned i = 0; i < join.predsSize(); ++i) {
        auto loc = join.getPredLocation(i);
        bool hasLoad = false;
        for (V from : froms) {
            if (loc->relations.hasLoad(from)) {
                hasLoad = true;
                break;
            }
        }
        if (!hasLoad)
            return {};
        changeLocations.emplace_back(loc);
    }
    return changeLocations;
}